

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCliqueTable.cpp
# Opt level: O0

void __thiscall
HighsCliqueTable::processInfeasibleVertices(HighsCliqueTable *this,HighsDomain *globaldom)

{
  bool bVar1;
  reference pvVar2;
  char *pcVar3;
  reference pvVar4;
  int __c;
  int __c_00;
  int __c_01;
  int __c_02;
  HighsDomain *in_RSI;
  long in_RDI;
  vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> clq;
  bool infeas;
  HighsHashTree<int,_void> vHashListsSizeTwo;
  HighsHashTree<int,_int> vHashLists;
  bool wasfixed;
  CliqueVar v;
  undefined4 in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffebc;
  vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
  *in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffecc;
  HighsDomain *in_stack_fffffffffffffed0;
  CliqueVar in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffedc;
  HighsCliqueTable *in_stack_fffffffffffffee0;
  CliqueVar in_stack_fffffffffffffee8;
  undefined2 in_stack_fffffffffffffeec;
  undefined1 in_stack_fffffffffffffeee;
  undefined1 in_stack_fffffffffffffeef;
  vector<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_>
  *in_stack_fffffffffffffef0;
  HighsDomain *in_stack_fffffffffffffef8;
  Reason in_stack_ffffffffffffff00;
  byte local_c9;
  vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> local_a8;
  CliqueVar local_80;
  CliqueVar local_7c;
  char local_78 [8];
  CliqueVar *local_70;
  HighsDomain *local_68;
  int local_5c;
  CliqueVar *local_50;
  HighsDomain *local_48;
  undefined1 local_3d;
  Reason local_20;
  byte local_15;
  CliqueVar local_14;
  HighsDomain *local_10;
  
  local_10 = in_RSI;
  do {
    do {
      bVar1 = std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
              ::empty((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                       *)in_stack_fffffffffffffed0);
      local_c9 = 0;
      if (!bVar1) {
        bVar1 = HighsDomain::infeasible(local_10);
        local_c9 = bVar1 ^ 0xff;
      }
      if ((local_c9 & 1) == 0) {
        propagateAndCleanup((HighsCliqueTable *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8)
        ;
        return;
      }
      std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::back
                (in_stack_fffffffffffffec0);
      local_14 = CliqueVar::complement
                           ((CliqueVar *)
                            CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
      std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
      pop_back((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *)
               0x5338ca);
      resolveSubstitution(in_stack_fffffffffffffee0,
                          (CliqueVar *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8)
                         );
      local_15 = HighsDomain::isFixed(in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
      local_20 = HighsDomain::Reason::unspecified();
      HighsDomain::fixCol(in_stack_fffffffffffffef8,
                          (HighsInt)((ulong)in_stack_fffffffffffffef0 >> 0x20),
                          (double)CONCAT17(in_stack_fffffffffffffeef,
                                           CONCAT16(in_stack_fffffffffffffeee,
                                                    CONCAT24(in_stack_fffffffffffffeec,
                                                             in_stack_fffffffffffffee8))),
                          in_stack_ffffffffffffff00);
      bVar1 = HighsDomain::infeasible(local_10);
      if (bVar1) {
        return;
      }
      if ((local_15 & 1) == 0) {
        *(int *)(in_RDI + 0x1c8) = *(int *)(in_RDI + 0x1c8) + 1;
      }
      pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0x178),
                          (ulong)((uint)local_14 & 0x7fffffff));
    } while (*pvVar2 != '\0');
    pcVar3 = (char *)(ulong)((uint)local_14 & 0x7fffffff);
    pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0x178),
                        (size_type)pcVar3);
    *pvVar2 = '\x01';
    in_stack_fffffffffffffef0 =
         (vector<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_> *)
         (in_RDI + 0x18);
    in_stack_fffffffffffffef8 = (HighsDomain *)&stack0xffffffffffffffec;
    pcVar3 = CliqueVar::index((CliqueVar *)in_stack_fffffffffffffef8,pcVar3,__c);
    pvVar4 = std::vector<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_>::
             operator[](in_stack_fffffffffffffef0,(long)(int)pcVar3);
    HighsHashTree<int,_int>::HighsHashTree
              ((HighsHashTree<int,_int> *)in_stack_fffffffffffffec0,
               (HighsHashTree<int,_int> *)
               CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    in_stack_ffffffffffffff00 = (Reason)(in_RDI + 0x30);
    pcVar3 = CliqueVar::index((CliqueVar *)in_stack_fffffffffffffef8,(char *)pvVar4,__c_00);
    std::vector<HighsHashTree<int,_void>,_std::allocator<HighsHashTree<int,_void>_>_>::operator[]
              ((vector<HighsHashTree<int,_void>,_std::allocator<HighsHashTree<int,_void>_>_> *)
               in_stack_ffffffffffffff00,(long)(int)pcVar3);
    HighsHashTree<int,_void>::HighsHashTree
              ((HighsHashTree<int,_void> *)in_stack_fffffffffffffec0,
               (HighsHashTree<int,_void> *)
               CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    local_50 = &stack0xffffffffffffffec;
    local_48 = local_10;
    in_stack_fffffffffffffeef =
         HighsHashTree<int,int>::
         for_each<HighsCliqueTable::processInfeasibleVertices(HighsDomain&)::__0>
                   ((HighsHashTree<int,_int> *)in_stack_fffffffffffffec0,
                    (anon_class_24_3_e13e751c *)
                    CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    local_3d = in_stack_fffffffffffffeef;
    if ((bool)in_stack_fffffffffffffeef) {
      local_5c = 1;
    }
    else {
      local_70 = &stack0xffffffffffffffec;
      local_68 = local_10;
      pcVar3 = local_78;
      in_stack_fffffffffffffeee =
           HighsHashTree<int,void>::
           for_each<HighsCliqueTable::processInfeasibleVertices(HighsDomain&)::__1>
                     ((HighsHashTree<int,_void> *)in_stack_fffffffffffffec0,
                      (anon_class_24_3_e13e751c *)
                      CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
      local_3d = in_stack_fffffffffffffeee;
      if ((bool)in_stack_fffffffffffffeee) {
        local_5c = 1;
      }
      else {
        in_stack_fffffffffffffee0 = (HighsCliqueTable *)(in_RDI + 0x18);
        in_stack_fffffffffffffee8 =
             CliqueVar::complement
                       ((CliqueVar *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
        local_7c = in_stack_fffffffffffffee8;
        pcVar3 = CliqueVar::index(&local_7c,pcVar3,__c_01);
        in_stack_fffffffffffffedc = (int)pcVar3;
        pvVar4 = std::vector<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_>::
                 operator[]((vector<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_>
                             *)in_stack_fffffffffffffee0,(long)in_stack_fffffffffffffedc);
        HighsHashTree<int,_int>::operator=
                  ((HighsHashTree<int,_int> *)in_stack_fffffffffffffed0,
                   (HighsHashTree<int,_int> *)
                   CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
        in_stack_fffffffffffffed0 = (HighsDomain *)(in_RDI + 0x30);
        in_stack_fffffffffffffed8 =
             CliqueVar::complement
                       ((CliqueVar *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
        local_80 = in_stack_fffffffffffffed8;
        pcVar3 = CliqueVar::index(&local_80,(char *)pvVar4,__c_02);
        in_stack_fffffffffffffecc = (int)pcVar3;
        std::vector<HighsHashTree<int,_void>,_std::allocator<HighsHashTree<int,_void>_>_>::
        operator[]((vector<HighsHashTree<int,_void>,_std::allocator<HighsHashTree<int,_void>_>_> *)
                   in_stack_fffffffffffffed0,(long)in_stack_fffffffffffffecc);
        HighsHashTree<int,_void>::operator=
                  ((HighsHashTree<int,_void> *)in_stack_fffffffffffffed0,
                   (HighsHashTree<int,_void> *)
                   CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
        if ((*(byte *)(in_RDI + 0x1d8) & 1) == 0) {
          HighsHashTree<int,void>::
          for_each<HighsCliqueTable::processInfeasibleVertices(HighsDomain&)::__3>
                    ((HighsHashTree<int,_void> *)in_stack_fffffffffffffec0,
                     (anon_class_8_1_8991fb9c *)
                     CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
          in_stack_fffffffffffffec0 = &local_a8;
          std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
          vector((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                  *)0x533cca);
          HighsHashTree<int,int>::
          for_each<HighsCliqueTable::processInfeasibleVertices(HighsDomain&)::__4>
                    ((HighsHashTree<int,_int> *)in_stack_fffffffffffffec0,
                     (anon_class_24_3_389c80ea *)
                     CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
          std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
          ~vector((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                   *)in_stack_fffffffffffffed0);
          local_5c = 0;
        }
        else {
          HighsHashTree<int,int>::
          for_each<HighsCliqueTable::processInfeasibleVertices(HighsDomain&)::__2>
                    ((HighsHashTree<int,_int> *)in_stack_fffffffffffffec0,
                     (anon_class_8_1_8991fb9c *)
                     CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
          local_5c = 2;
        }
      }
    }
    HighsHashTree<int,_void>::~HighsHashTree((HighsHashTree<int,_void> *)in_stack_fffffffffffffec0);
    HighsHashTree<int,_int>::~HighsHashTree((HighsHashTree<int,_int> *)in_stack_fffffffffffffec0);
    in_stack_fffffffffffffebc = local_5c;
  } while ((local_5c == 0) || (local_5c != 1));
  return;
}

Assistant:

void HighsCliqueTable::processInfeasibleVertices(HighsDomain& globaldom) {
  while (!infeasvertexstack.empty() && !globaldom.infeasible()) {
    CliqueVar v = infeasvertexstack.back().complement();
    infeasvertexstack.pop_back();

    resolveSubstitution(v);
    bool wasfixed = globaldom.isFixed(v.col);
    globaldom.fixCol(v.col, double(v.val));
    if (globaldom.infeasible()) return;
    if (!wasfixed) ++nfixings;
    if (colDeleted[v.col]) continue;
    colDeleted[v.col] = true;

    HighsHashTree<HighsInt, HighsInt> vHashLists =
        std::move(invertedHashList[v.index()]);
    HighsHashTree<HighsInt> vHashListsSizeTwo =
        std::move(invertedHashListSizeTwo[v.index()]);

    bool infeas = vHashLists.for_each([&](HighsInt cliqueid) {
      HighsInt start = cliques[cliqueid].start;
      HighsInt end = cliques[cliqueid].end;

      for (HighsInt i = start; i != end; ++i) {
        if (cliqueentries[i].col == v.col) continue;

        bool wasfixed = globaldom.isFixed(cliqueentries[i].col);
        globaldom.fixCol(cliqueentries[i].col,
                         double(1 - cliqueentries[i].val));
        if (globaldom.infeasible()) return true;
        if (!wasfixed) {
          ++nfixings;
          infeasvertexstack.push_back(cliqueentries[i]);
        }
      }

      removeClique(cliqueid);
      return false;
    });

    if (infeas) return;

    infeas = vHashListsSizeTwo.for_each([&](HighsInt cliqueid) {
      HighsInt start = cliques[cliqueid].start;
      HighsInt end = cliques[cliqueid].end;

      for (HighsInt i = start; i != end; ++i) {
        if (cliqueentries[i].col == v.col) continue;

        bool wasfixed = globaldom.isFixed(cliqueentries[i].col);
        globaldom.fixCol(cliqueentries[i].col,
                         double(1 - cliqueentries[i].val));
        if (globaldom.infeasible()) return true;
        if (!wasfixed) {
          ++nfixings;
          infeasvertexstack.push_back(cliqueentries[i]);
        }
      }

      removeClique(cliqueid);
      return false;
    });

    if (infeas) return;

    vHashLists = std::move(invertedHashList[v.complement().index()]);
    vHashListsSizeTwo =
        std::move(invertedHashListSizeTwo[v.complement().index()]);

    if (inPresolve) {
      // during presolve we only count the number of zeros within each clique
      // and only remove fully redundant cliques that are larger than two
      // in the process since during presolve a lot of cliques of size two
      // may be found by probing and will be deleted upon rebuild anyways
      vHashLists.for_each([&](HighsInt cliqueid) {
        cliques[cliqueid].numZeroFixed += 1;
        if (cliques[cliqueid].end - cliques[cliqueid].start -
                cliques[cliqueid].numZeroFixed <=
            1)
          removeClique(cliqueid);
      });
      continue;
    }

    vHashListsSizeTwo.for_each(
        [&](HighsInt cliqueid) { removeClique(cliqueid); });

    assert(cliquehitinds.empty());
    std::vector<CliqueVar> clq;
    vHashLists.for_each([&](HighsInt cliqueid) {
      // assert(cliqueentries[entry.value()].val == 1 - v.val);

      cliques[cliqueid].numZeroFixed += 1;
      if (cliques[cliqueid].end - cliques[cliqueid].start -
              cliques[cliqueid].numZeroFixed <=
          1) {
        removeClique(cliqueid);
      } else if (cliques[cliqueid].numZeroFixed >=
                 std::max(
                     HighsInt{10},
                     (cliques[cliqueid].end - cliques[cliqueid].start) >> 1)) {
        clq.assign(cliqueentries.begin() + cliques[cliqueid].start,
                   cliqueentries.begin() + cliques[cliqueid].end);

        auto computeNumDeleted = [&](const std::vector<CliqueVar>& clq) {
          HighsInt numDel = 0;
          for (CliqueVar x : clq) numDel += colDeleted[x.col];
          return numDel;
        };

        assert(computeNumDeleted(clq) == cliques[cliqueid].numZeroFixed);

        removeClique(cliqueid);
        clq.erase(std::remove_if(clq.begin(), clq.end(),
                                 [&](CliqueVar x) {
                                   return globaldom.isFixed(x.col) &&
                                          globaldom.col_lower_[x.col] ==
                                              1 - x.val;
                                 }),
                  clq.end());
        if (clq.size() > 1) doAddClique(clq.data(), clq.size());
      }
    });
  }

  propagateAndCleanup(globaldom);
}